

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O3

void __thiscall OpenMD::ZConstraintForceModifier::doZconstraintForce(ZConstraintForceModifier *this)

{
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *plVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  Molecule *pMVar4;
  StuntDouble *pSVar5;
  pointer ppSVar6;
  _List_node_base **pp_Var7;
  _List_node_base *p_Var8;
  long lVar9;
  pointer ppSVar10;
  uint i;
  _List_node_base *p_Var11;
  long lVar12;
  uint i_1;
  _List_node_base *p_Var13;
  pointer ppMVar14;
  _List_node_base *p_Var15;
  RealType RVar16;
  double dVar17;
  double local_68 [4];
  double local_48;
  undefined8 uStack_40;
  
  plVar1 = &this->fixedZMols_;
  p_Var13 = (this->fixedZMols_).
            super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  dVar17 = 0.0;
  p_Var8 = p_Var13;
  if (p_Var13 != (_List_node_base *)plVar1) {
    do {
      p_Var8[3]._M_next = (_List_node_base *)0x0;
      p_Var11 = p_Var8[1]._M_next[10]._M_next;
      p_Var2 = *(_List_node_base **)((long)(p_Var8[1]._M_next + 10) + 8);
      p_Var15 = (_List_node_base *)0x0;
      if (p_Var11 != p_Var2) {
        p_Var3 = p_Var11->_M_next;
        while (p_Var3 != (_List_node_base *)0x0) {
          p_Var11 = (_List_node_base *)&p_Var11->_M_prev;
          p_Var15 = (_List_node_base *)
                    ((double)p_Var15 +
                    *(double *)
                     (*(long *)((long)(*(_List_node_base **)
                                        ((long)(*(_List_node_base **)((long)(p_Var3 + 1) + 8) + 1) +
                                        8) + 3) + (long)p_Var3[1]._M_next) + 0x10 +
                     (long)*(int *)&p_Var3[3]._M_next * 0x18));
          p_Var8[3]._M_next = p_Var15;
          if (p_Var11 == p_Var2) break;
          p_Var3 = p_Var11->_M_next;
        }
      }
      dVar17 = dVar17 + (double)p_Var15;
      pp_Var7 = &p_Var8->_M_next;
      p_Var8 = *pp_Var7;
    } while (*pp_Var7 != (_List_node_base *)plVar1);
    for (; p_Var13 != (_List_node_base *)plVar1; p_Var13 = p_Var13->_M_next) {
      pMVar4 = (Molecule *)p_Var13[1]._M_next;
      for (ppSVar10 = (pMVar4->integrableObjects_).
                      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          (ppSVar10 !=
           (pMVar4->integrableObjects_).
           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl
           .super__Vector_impl_data._M_finish && (pSVar5 = *ppSVar10, pSVar5 != (StuntDouble *)0x0))
          ; ppSVar10 = ppSVar10 + 1) {
        local_68[0] = 0.0;
        local_68[1] = 0.0;
        local_48 = -pSVar5->mass_ * (double)p_Var13[3]._M_next;
        uStack_40 = 0x8000000000000000;
        RVar16 = Molecule::getMass(pMVar4);
        local_68[2] = local_48 / RVar16;
        lVar9 = (long)pSVar5->localIndex_ * 0x18 +
                *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).force.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
        lVar12 = 0;
        do {
          *(double *)(lVar9 + lVar12 * 8) = local_68[lVar12] + *(double *)(lVar9 + lVar12 * 8);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
      }
    }
  }
  for (p_Var13 = (this->movingZMols_).
                 super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
                 _M_impl._M_node.super__List_node_base._M_next;
      p_Var13 != (_List_node_base *)&this->movingZMols_; p_Var13 = p_Var13->_M_next) {
    pMVar4 = (Molecule *)p_Var13[1]._M_next;
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    RVar16 = Molecule::getMass(pMVar4);
    local_68[2] = (-RVar16 * dVar17) / (this->totMassUnconsMols_ + this->totMassMovingZMols_);
    ppSVar6 = (pMVar4->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppSVar10 = (pMVar4->integrableObjects_).
                    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        (ppSVar10 != ppSVar6 && (pSVar5 = *ppSVar10, pSVar5 != (StuntDouble *)0x0));
        ppSVar10 = ppSVar10 + 1) {
      lVar9 = (long)pSVar5->localIndex_ * 0x18 +
              *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).force.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
      lVar12 = 0;
      do {
        *(double *)(lVar9 + lVar12 * 8) = local_68[lVar12] + *(double *)(lVar9 + lVar12 * 8);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
    }
  }
  for (ppMVar14 = (this->unzconsMols_).
                  super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      ppMVar14 !=
      (this->unzconsMols_).
      super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppMVar14 = ppMVar14 + 1) {
    pMVar4 = *ppMVar14;
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    RVar16 = Molecule::getMass(pMVar4);
    local_68[2] = (-RVar16 * dVar17) / (this->totMassUnconsMols_ + this->totMassMovingZMols_);
    ppSVar6 = (pMVar4->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppSVar10 = (pMVar4->integrableObjects_).
                    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        (ppSVar10 != ppSVar6 && (pSVar5 = *ppSVar10, pSVar5 != (StuntDouble *)0x0));
        ppSVar10 = ppSVar10 + 1) {
      lVar9 = (long)pSVar5->localIndex_ * 0x18 +
              *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).force.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
      lVar12 = 0;
      do {
        *(double *)(lVar9 + lVar12 * 8) = local_68[lVar12] + *(double *)(lVar9 + lVar12 * 8);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
    }
  }
  return;
}

Assistant:

void ZConstraintForceModifier::doZconstraintForce() {
    RealType totalFZ(0.0);

    // Calculate the total z-contraint force on the fixed molecules:

    std::list<ZconstraintMol>::iterator i;
    Molecule* mol;
    StuntDouble* sd;
    Molecule::IntegrableObjectIterator ii;

    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      mol   = i->mol;
      i->fz = 0.0;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        i->fz += (sd->getFrc())[whichDirection];
      }

      totalFZ += i->fz;
    }

#ifdef IS_MPI
    // collect the total z-constraint force
    MPI_Allreduce(MPI_IN_PLACE, &totalFZ, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // apply negative force to fixed z-constrained molecules:
    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      mol = i->mol;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        Vector3d force(0.0);
        force[whichDirection] = -getZFOfFixedZMols(mol, sd, i->fz);

        sd->addFrc(force);
      }
    }

    // modify the forces of the currently moving z-constrained
    // molecules so that system stays fixed:
    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol = i->mol;

      Vector3d force(0.0);
      force[whichDirection] = -getZFOfMovingMols(mol, totalFZ);

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        sd->addFrc(force);
      }
    }

    // modify the forces of unconstrained molecules so that the system
    // stays fixed:
    std::vector<Molecule*>::iterator j;
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol = *j;

      Vector3d force(0.0);
      force[whichDirection] = -getZFOfMovingMols(mol, totalFZ);

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        sd->addFrc(force);
      }
    }
  }